

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1afm.c
# Opt level: O0

FT_Int t1_get_index(char *name,FT_Offset len,void *user_data)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char *gname;
  FT_Int n;
  T1_Font type1;
  void *user_data_local;
  FT_Offset len_local;
  char *name_local;
  
  if (len < 0x10000) {
    for (gname._4_4_ = 0; gname._4_4_ < *(int *)((long)user_data + 0x188);
        gname._4_4_ = gname._4_4_ + 1) {
      __s = *(char **)(*(long *)((long)user_data + 400) + (long)gname._4_4_ * 8);
      if ((((__s != (char *)0x0) && (*__s == *name)) && (sVar2 = strlen(__s), sVar2 == len)) &&
         (iVar1 = strncmp(__s,name,len), iVar1 == 0)) {
        return gname._4_4_;
      }
    }
  }
  return 0;
}

Assistant:

static FT_Int
  t1_get_index( const char*  name,
                FT_Offset    len,
                void*        user_data )
  {
    T1_Font  type1 = (T1_Font)user_data;
    FT_Int   n;


    /* PS string/name length must be < 16-bit */
    if ( len > 0xFFFFU )
      return 0;

    for ( n = 0; n < type1->num_glyphs; n++ )
    {
      char*  gname = (char*)type1->glyph_names[n];


      if ( gname && gname[0] == name[0]        &&
           ft_strlen( gname ) == len           &&
           ft_strncmp( gname, name, len ) == 0 )
        return n;
    }

    return 0;
  }